

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O2

void __thiscall CoreML::ShapeRange::ShapeRange(ShapeRange *this,size_t min,size_t max)

{
  ostream *poVar1;
  runtime_error *this_00;
  string asStack_1c8 [32];
  stringstream ss;
  ostream local_198 [376];
  
  RangeValue::RangeValue(&this->_minimum,min);
  RangeValue::RangeValue(&this->_maximum,max);
  if (min <= max) {
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar1 = std::operator<<(local_198,"Constructing invalid ShapeRange with ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,", ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,asStack_1c8);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

ShapeRange::ShapeRange(size_t min, size_t max)
:
_minimum(min),
_maximum(max)
{
    if (min > max) {
        std::stringstream ss;
        ss << "Constructing invalid ShapeRange with " << min << ", " << max;
        throw std::runtime_error(ss.str());
    }
}